

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadbase.c
# Opt level: O3

int searchAll48(uint64_t **seedbuf,uint64_t *buflen,char *path,int threads,uint64_t *lowBits,
               int lowBitN,_func_int_uint64_t_void_ptr *check,void *data,char *stop)

{
  ulong uVar1;
  long __off;
  __dev_t *p_Var2;
  void *pvVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  void *__ptr;
  pthread_t *__ptr_00;
  size_t sVar7;
  ulong uVar8;
  FILE *pFVar9;
  uint64_t *puVar10;
  uint uVar11;
  char *pcVar12;
  void *pvVar13;
  long lVar14;
  uint64_t uVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  pthread_t *__newthread;
  void *pvVar19;
  long lVar20;
  int64_t lentry;
  char dpath [4096];
  stat local_10c8;
  char local_1038 [4104];
  
  uVar18 = (ulong)threads;
  __ptr = malloc(uVar18 * 0x1370);
  __ptr_00 = (pthread_t *)malloc(uVar18 * 8);
  if (path == (char *)0x0) {
    iVar6 = 1;
    if (buflen == (uint64_t *)0x0 || seedbuf == (uint64_t **)0x0) goto LAB_00129bad;
  }
  else {
    sVar7 = strlen(path);
    if (sVar7 - 0xff8 < 0xfffffffffffff000) goto LAB_001295f7;
    strcpy(local_1038,path);
    uVar8 = sVar7 & 0xffffffff;
    do {
      uVar8 = uVar8 - 1;
      if ((int)(uint)uVar8 < 0) goto LAB_0012971e;
      uVar11 = (uint)uVar8 & 0x7fffffff;
    } while (local_1038[uVar11] != '/');
    local_1038[uVar11] = '\0';
    sVar7 = strlen(local_1038);
    pcVar16 = (char *)((long)local_10c8.__unused + 0x17);
    do {
      pcVar12 = pcVar16 + 1;
      pcVar16 = pcVar16 + 1;
    } while (*pcVar12 == '/');
    if (pcVar16 < local_1038 + (int)sVar7) {
      pcVar12 = pcVar16;
LAB_001296a7:
      do {
        pcVar4 = pcVar16;
        pcVar16 = pcVar4 + 1;
        if (*pcVar4 != '\0') {
          if (*pcVar4 != '/') goto LAB_001296a7;
        }
        if (pcVar12 != local_1038) {
          pcVar12[-1] = '/';
        }
        *pcVar4 = '\0';
        iVar6 = stat(local_1038,&local_10c8);
        if (iVar6 == -1) {
          uVar11 = mkdir(local_1038,0x1ed);
        }
        else {
          uVar11 = (uint)((local_10c8.st_mode & 0xf000) != 0x4000);
        }
        if ((uVar11 != 0) || (pcVar12 = pcVar16, local_1038 + (int)sVar7 <= pcVar16))
        goto LAB_00129707;
      } while( true );
    }
  }
  goto LAB_0012971e;
LAB_00129707:
  if (uVar11 != 0) {
LAB_001295f7:
    iVar6 = 1;
    goto LAB_00129bad;
  }
LAB_0012971e:
  if (0 < threads) {
    uVar17 = (ulong)(uint)threads;
    uVar8 = 0;
    do {
      lVar14 = uVar8 * 0x1370;
      p_Var2 = (__dev_t *)(lVar14 + (long)__ptr);
      uVar1 = uVar8 + 1;
      *(ulong *)((long)__ptr + lVar14) = (uVar8 << 0x30) / uVar18;
      *(ulong *)((long)__ptr + lVar14 + 8) = (uVar1 << 0x30) / uVar18 - 1;
      *(uint64_t **)((long)__ptr + lVar14 + 0x10) = lowBits;
      *(int *)((long)__ptr + lVar14 + 0x18) = lowBitN;
      *(undefined1 *)((long)__ptr + lVar14 + 0x1c) = 0;
      *(_func_int_uint64_t_void_ptr **)((long)__ptr + lVar14 + 0x20) = check;
      *(void **)((long)__ptr + lVar14 + 0x28) = data;
      *(char **)((long)__ptr + lVar14 + 0x30) = stop;
      if (path == (char *)0x0) {
        *(undefined1 *)(p_Var2 + 7) = 0;
        p_Var2[0x207] = 0;
      }
      else {
        pcVar16 = (char *)((long)__ptr + lVar14 + 0x38);
        snprintf(pcVar16,0x1000,"%s.part%d",path,uVar8 & 0xffffffff);
        pFVar9 = fopen(pcVar16,"a+");
        if (pFVar9 == (FILE *)0x0) {
          iVar6 = 1;
          goto LAB_00129bad;
        }
        lVar20 = 0;
        bVar5 = false;
        lVar14 = 0;
        do {
          __off = lVar14 + -1;
          iVar6 = fseek(pFVar9,__off,2);
          if (((iVar6 != 0) || (iVar6 = fgetc(pFVar9), iVar6 < 1)) || (bVar5 && iVar6 == 10)) {
            iVar6 = fseek(pFVar9,lVar20 >> 0x20,2);
            if (((iVar6 == 0) && (sVar7 = fread(local_1038,-lVar14,1,pFVar9), sVar7 != 0)) &&
               (iVar6 = __isoc99_sscanf(local_1038,"%ld",&local_10c8), iVar6 == 1)) {
              *p_Var2 = local_10c8.st_dev;
              *(undefined1 *)((long)p_Var2 + 0x1c) = 1;
              printf("Continuing thread %d at seed %ld\n");
            }
            break;
          }
          bVar5 = (bool)(bVar5 | iVar6 != 10);
          lVar20 = lVar20 + -0x100000000;
          lVar14 = __off;
        } while (__off != -0x1f);
        fseek(pFVar9,0,2);
        p_Var2[0x207] = (__dev_t)pFVar9;
      }
      uVar8 = uVar1;
    } while (uVar1 != uVar17);
    uVar18 = uVar17;
    __newthread = __ptr_00;
    pvVar13 = __ptr;
    if (0 < threads) {
      do {
        pthread_create(__newthread,(pthread_attr_t *)0x0,searchAll48Thread,pvVar13);
        uVar18 = uVar18 - 1;
        __newthread = __newthread + 1;
        pvVar13 = (void *)((long)pvVar13 + 0x1370);
      } while (uVar18 != 0);
      if (0 < threads) {
        uVar18 = 0;
        do {
          pthread_join(__ptr_00[uVar18],(void **)0x0);
          uVar18 = uVar18 + 1;
        } while (uVar17 != uVar18);
      }
    }
  }
  if ((stop == (char *)0x0) || (iVar6 = 1, *stop == '\0')) {
    if (path == (char *)0x0) {
      *buflen = 0;
      if (threads < 1) {
        iVar6 = 0;
        puVar10 = (uint64_t *)malloc(0);
        *seedbuf = puVar10;
        if (puVar10 == (uint64_t *)0x0) goto LAB_00129beb;
      }
      else {
        uVar18 = 0;
        uVar15 = 0;
        do {
          lVar14 = (long)__ptr + uVar18 * 0x1370 + 0x1040;
          do {
            uVar15 = uVar15 + *(long *)(lVar14 + 800);
            *buflen = uVar15;
            lVar14 = *(long *)(lVar14 + 0x328);
          } while (lVar14 != 0);
          uVar18 = uVar18 + 1;
        } while (uVar18 != (uint)threads);
        puVar10 = (uint64_t *)malloc(uVar15 * 8);
        *seedbuf = puVar10;
        if (puVar10 == (uint64_t *)0x0) {
LAB_00129beb:
          exit(1);
        }
        if (threads < 1) {
          iVar6 = 0;
        }
        else {
          uVar18 = 0;
          lVar14 = 0;
          do {
            pvVar19 = (void *)((long)__ptr + uVar18 * 0x1370 + 0x1040);
            pvVar13 = pvVar19;
            do {
              memcpy(*seedbuf + (int)lVar14,pvVar13,*(long *)((long)pvVar13 + 800) << 3);
              lVar14 = (long)(int)lVar14 + *(long *)((long)pvVar13 + 800);
              pvVar3 = *(void **)((long)pvVar13 + 0x328);
              if (pvVar13 != pvVar19) {
                free(pvVar13);
              }
              pvVar13 = pvVar3;
            } while (pvVar3 != (void *)0x0);
            uVar18 = uVar18 + 1;
            iVar6 = 0;
          } while (uVar18 != (uint)threads);
        }
      }
    }
    else {
      pFVar9 = fopen(path,"w");
      iVar6 = 1;
      if (pFVar9 != (FILE *)0x0) {
        if (0 < threads) {
          uVar18 = 0;
          do {
            lVar14 = uVar18 * 0x1370;
            rewind(*(FILE **)((long)__ptr + lVar14 + 0x1038));
            while (sVar7 = fread(local_1038,1,0x1000,*(FILE **)((long)__ptr + lVar14 + 0x1038)),
                  sVar7 != 0) {
              sVar7 = fwrite(local_1038,1,sVar7,pFVar9);
              if (sVar7 == 0) {
                fclose(pFVar9);
                goto LAB_00129bad;
              }
            }
            fclose(*(FILE **)((long)__ptr + lVar14 + 0x1038));
            remove((char *)((long)__ptr + lVar14 + 0x38));
            uVar18 = uVar18 + 1;
          } while (uVar18 != (uint)threads);
        }
        fclose(pFVar9);
        iVar6 = 0;
        if (buflen != (uint64_t *)0x0 && seedbuf != (uint64_t **)0x0) {
          puVar10 = loadSavedSeeds(path,buflen);
          *seedbuf = puVar10;
        }
      }
    }
  }
LAB_00129bad:
  free(__ptr_00);
  free(__ptr);
  return iVar6;
}

Assistant:

int searchAll48(
        uint64_t **         seedbuf,
        uint64_t *          buflen,
        const char *        path,
        int                 threads,
        const uint64_t *    lowBits,
        int                 lowBitN,
        int (*check)(uint64_t s48, void *data),
        void *              data,
        volatile char *     stop
        )
{
    threadinfo_t *info = (threadinfo_t*) malloc(threads* sizeof(*info));
    thread_id_t *tids = (thread_id_t*) malloc(threads* sizeof(*tids));
    int i, t;
    int err = 0;

    if (path)
    {
        size_t pathlen = strlen(path);
        char dpath[MAX_PATHLEN];

        // split path into directory and file and create missing directories
        if (pathlen + 8 >= sizeof(dpath))
            goto L_err;
        strcpy(dpath, path);

        for (i = pathlen-1; i >= 0; i--)
        {
            if (IS_DIR_SEP(dpath[i]))
            {
                dpath[i] = 0;
                if (mkdirp(dpath))
                    goto L_err;
                break;
            }
        }
    }
    else if (seedbuf == NULL || buflen == NULL)
    {
        // no file and no buffer return: no output possible
        goto L_err;
    }

    // prepare the thread info and load progress if present
    for (t = 0; t < threads; t++)
    {
        info[t].start = (t * (MASK48+1) / threads);
        info[t].end = ((t+1) * (MASK48+1) / threads - 1);
        info[t].lowBits = lowBits;
        info[t].lowBitN = lowBitN;
        info[t].skipStart = 0;
        info[t].check = check;
        info[t].data = data;
        info[t].stop = stop;

        if (path)
        {
            // progress file of this thread
            snprintf(info[t].path, sizeof(info[t].path), "%s.part%d", path, t);
            FILE *fp = fopen(info[t].path, "a+");
            if (fp == NULL)
                goto L_err;

            int c, nnl = 0;
            char buf[32];

            // find the last newline
            for (i = 1; i < 32; i++)
            {
                if (fseek(fp, -i, SEEK_END)) break;
                c = fgetc(fp);
                if (c <= 0 || (nnl && c == '\n')) break;
                nnl |= (c != '\n');
            }

            if (i < 32 && !fseek(fp, 1-i, SEEK_END) && fread(buf, i-1, 1, fp) > 0)
            {
                // read the last entry, and replace the start seed accordingly
                int64_t lentry;
                if (sscanf(buf, "%" PRId64, &lentry) == 1)
                {
                    info[t].start = lentry;
                    info[t].skipStart = 1;
                    printf("Continuing thread %d at seed %" PRId64 "\n",
                        t, lentry);
                }
            }

            fseek(fp, 0, SEEK_END);
            info[t].fp = fp;
        }
        else
        {
            info[t].path[0] = 0;
            info[t].fp = NULL;
        }
    }


    // run the threads
#ifdef USE_PTHREAD

    for (t = 0; t < threads; t++)
    {
        pthread_create(&tids[t], NULL, searchAll48Thread, (void*)&info[t]);
    }

    for (t = 0; t < threads; t++)
    {
        pthread_join(tids[t], NULL);
    }

#else

    for (t = 0; t < threads; t++)
    {
        tids[t] = CreateThread(NULL, 0, searchAll48Thread,
            (LPVOID)&info[t], 0, NULL);
    }

    WaitForMultipleObjects(threads, tids, TRUE, INFINITE);

#endif

    if (stop && *stop)
        goto L_err;

    if (path)
    {
        // merge partial files
        FILE *fp = fopen(path, "w");
        if (fp == NULL)
            goto L_err;

        for (t = 0; t < threads; t++)
        {
            rewind(info[t].fp);

            char buffer[4097];
            size_t n;
            while ((n = fread(buffer, sizeof(char), 4096, info[t].fp)))
            {
                if (!fwrite(buffer, sizeof(char), n, fp))
                {
                    fclose(fp);
                    goto L_err;
                }
            }

            fclose(info[t].fp);
            remove(info[t].path);
        }

        fclose(fp);

        if (seedbuf && buflen)
        {
            *seedbuf = loadSavedSeeds(path, buflen);
        }
    }
    else
    {
        // merge linked seed buffers
        *buflen = 0;

        for (t = 0; t < threads; t++)
        {
            linked_seeds_t *lp = &info[t].ls;
            do
            {
                *buflen += lp->len;
                lp = lp->next;
            }
            while (lp);
        }

        *seedbuf = (uint64_t*) malloc((*buflen) * sizeof(uint64_t));
        if (*seedbuf == NULL)
            exit(1);

        i = 0;
        for (t = 0; t < threads; t++)
        {
            linked_seeds_t *lp = &info[t].ls;
            do
            {
                memcpy(*seedbuf + i, lp->seeds, lp->len * sizeof(uint64_t));
                i += lp->len;
                linked_seeds_t *tmp = lp;
                lp = lp->next;
                if (tmp != &info[t].ls)
                    free(tmp);
            }
            while (lp);
        }
    }

    if (0)
L_err:
        err = 1;

    free(tids);
    free(info);

    return err;
}